

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlers.c
# Opt level: O3

int chirc_handle(chirc_ctx_t *ctx,chirc_connection_t *conn,chirc_message_t *msg)

{
  char **ppcVar1;
  char *__s1;
  int iVar2;
  ulong uVar3;
  handler_entry *phVar4;
  
  serverlog(DEBUG,conn,"Handling command %s",msg->cmd);
  if (msg->nparams != 0) {
    uVar3 = 0;
    do {
      ppcVar1 = msg->params + uVar3;
      uVar3 = uVar3 + 1;
      serverlog(DEBUG,conn,"%s[%i] = %s",msg->cmd,uVar3 & 0xffffffff,*ppcVar1);
    } while (uVar3 < msg->nparams);
  }
  if (handlers[0].name != (char *)0x0) {
    __s1 = msg->cmd;
    iVar2 = strcmp(__s1,handlers[0].name);
    phVar4 = handlers;
    while( true ) {
      if (iVar2 == 0) {
        iVar2 = (*phVar4->func)(ctx,conn,msg);
        return iVar2;
      }
      if (phVar4[1].name == (char *)0x0) break;
      iVar2 = strcmp(__s1,phVar4[1].name);
      phVar4 = phVar4 + 1;
    }
  }
  return 0;
}

Assistant:

int chirc_handle(chirc_ctx_t *ctx, chirc_connection_t *conn, chirc_message_t *msg)
{
    chirc_message_t reply;
    int rc=0, h;

    /* Print message to the server log */
    serverlog(DEBUG, conn, "Handling command %s", msg->cmd);
    for(int i=0; i<msg->nparams; i++)
        serverlog(DEBUG, conn, "%s[%i] = %s", msg->cmd, i + 1, msg->params[i]);

    /* Search the dispatch table for an entry corresponding to the
     * message we are processing */
    for(h=0; handlers[h].name != NULL; h++)
        if (!strcmp(msg->cmd, handlers[h].name))
        {

            rc = handlers[h].func(ctx, conn, msg);
            break;
        }


    return rc;
}